

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O0

bool __thiscall
double_conversion::DoubleToStringConverter::ToFixed
          (DoubleToStringConverter *this,double value,int requested_digits,
          StringBuilder *result_builder)

{
  bool bVar1;
  int in_ESI;
  StringBuilder *in_RDI;
  double in_XMM0_Qa;
  bool unique_zero;
  int decimal_rep_length;
  char decimal_rep [121];
  int kDecimalRepCapacity;
  bool sign;
  int decimal_point;
  double kFirstNonFixed;
  double in_stack_ffffffffffffff18;
  char c;
  StringBuilder *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff30;
  int decimal_point_00;
  int in_stack_ffffffffffffff34;
  DoubleToStringConverter *in_stack_ffffffffffffff38;
  DoubleToStringConverter *in_stack_ffffffffffffff40;
  int *in_stack_ffffffffffffff98;
  bool *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int *point;
  bool local_1;
  
  point = (int *)0x4c63e9e4e4c2f344;
  Double::Double((Double *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  bVar1 = Double::IsSpecial((Double *)in_stack_ffffffffffffff20);
  if (bVar1) {
    local_1 = HandleSpecialValues(in_stack_ffffffffffffff38,
                                  (double)CONCAT44(in_stack_ffffffffffffff34,
                                                   in_stack_ffffffffffffff30),in_RDI);
  }
  else if (in_ESI < 0x3d) {
    if ((1e+60 <= in_XMM0_Qa) || (in_XMM0_Qa <= -1e+60)) {
      local_1 = false;
    }
    else {
      c = (char)((ulong)&stack0xffffffffffffffc4 >> 0x38);
      DoubleToAscii((double)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),0x79,
                    in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                    in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,point);
      bVar1 = ((ulong)(in_RDI->buffer_).start_ & 8) != 0;
      decimal_point_00 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff30);
      if (((in_stack_ffffffffffffffc0 & 0x1000000) != 0) &&
         (((in_XMM0_Qa != 0.0 || (NAN(in_XMM0_Qa))) || (!bVar1)))) {
        StringBuilder::AddCharacter(in_stack_ffffffffffffff20,c);
      }
      CreateDecimalRepresentation
                (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38,
                 in_stack_ffffffffffffff34,decimal_point_00,(int)((ulong)in_RDI >> 0x20),
                 in_stack_ffffffffffffff20);
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool DoubleToStringConverter::ToFixed(double value,
                                      int requested_digits,
                                      StringBuilder* result_builder) const {
  DOUBLE_CONVERSION_ASSERT(kMaxFixedDigitsBeforePoint == 60);
  const double kFirstNonFixed = 1e60;

  if (Double(value).IsSpecial()) {
    return HandleSpecialValues(value, result_builder);
  }

  if (requested_digits > kMaxFixedDigitsAfterPoint) return false;
  if (value >= kFirstNonFixed || value <= -kFirstNonFixed) return false;

  // Find a sufficiently precise decimal representation of n.
  int decimal_point;
  bool sign;
  // Add space for the '\0' byte.
  const int kDecimalRepCapacity =
      kMaxFixedDigitsBeforePoint + kMaxFixedDigitsAfterPoint + 1;
  char decimal_rep[kDecimalRepCapacity];
  int decimal_rep_length;
  DoubleToAscii(value, FIXED, requested_digits,
                decimal_rep, kDecimalRepCapacity,
                &sign, &decimal_rep_length, &decimal_point);

  bool unique_zero = ((flags_ & UNIQUE_ZERO) != 0);
  if (sign && (value != 0.0 || !unique_zero)) {
    result_builder->AddCharacter('-');
  }

  CreateDecimalRepresentation(decimal_rep, decimal_rep_length, decimal_point,
                              requested_digits, result_builder);
  return true;
}